

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::AssertControlTask::checkArguments
          (AssertControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  ulong uVar4;
  anon_class_1_0_00000001 local_31;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,(ulong)this->isFullMethod,
                     0x7fffffff);
  if (bVar2) {
    for (uVar4 = 0; uVar4 < (args->_M_extent)._M_extent_value; uVar4 = uVar4 + 1) {
      bVar2 = uVar4 != 0;
      if (this->isFullMethod != false) {
        bVar2 = 3 < uVar4;
      }
      if (bVar2) {
        if ((args->_M_ptr[uVar4]->kind != ArbitrarySymbol) ||
           (bVar2 = checkArguments::anon_class_1_0_00000001::operator()
                              (&local_31,*(Symbol **)(args->_M_ptr[uVar4] + 1)), !bVar2)) {
          bVar2 = Scope::isUninstantiated((context->scope).ptr);
          if (!bVar2) {
            ASTContext::addDiag(context,(DiagCode)0xe000b,args->_M_ptr[uVar4]->sourceRange);
          }
          goto LAB_003abf0e;
        }
      }
      else {
        bVar2 = Type::isIntegral((args->_M_ptr[uVar4]->type).ptr);
        if (!bVar2) {
          pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar4]);
          return pTVar3;
        }
      }
    }
    pTVar3 = pCVar1->voidType;
  }
  else {
LAB_003abf0e:
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isFullMethod ? 1 : 0, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            // If this is $assertcontrol, the first four args are integer expressions.
            // Otherwise, only the first arg is an integer expression. The rest, in both
            // cases, are hierarchical references.
            if ((isFullMethod && i < 4) || (!isFullMethod && i == 0)) {
                if (!args[i]->type->isIntegral())
                    return badArg(context, *args[i]);
            }
            else {
                auto isScope = [](const Symbol& symbol) {
                    return symbol.isScope() || symbol.kind == SymbolKind::Instance;
                };

                if (args[i]->kind != ExpressionKind::ArbitrarySymbol ||
                    !isScope(*args[i]->as<ArbitrarySymbolExpression>().symbol)) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedScopeOrAssert, args[i]->sourceRange);
                    return comp.getErrorType();
                }
            }
        }

        return comp.getVoidType();
    }